

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmCommonTargetGenerator::AddModuleDefinitionFlag
          (cmCommonTargetGenerator *this,cmLinkLineComputer *linkLineComputer,string *flags)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *pcVar1;
  string *config;
  ulong uVar2;
  char *__s;
  string local_d0;
  string local_b0;
  allocator<char> local_89;
  string local_88 [8];
  string flag;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *defFileFlag;
  ModuleDefinitionInfo *mdi;
  string *flags_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmCommonTargetGenerator *this_local;
  
  this_00 = this->GeneratorTarget;
  mdi = (ModuleDefinitionInfo *)flags;
  flags_local = (string *)linkLineComputer;
  linkLineComputer_local = (cmLinkLineComputer *)this;
  config = GetConfigName_abi_cxx11_(this);
  defFileFlag = (char *)cmGeneratorTarget::GetModuleDefinitionInfo(this_00,config);
  if (((ModuleDefinitionInfo *)defFileFlag != (ModuleDefinitionInfo *)0x0) &&
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    this_01 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"CMAKE_LINK_DEF_FILE_FLAG",&local_51);
    __s = cmMakefile::GetDefinition(this_01,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    if (__s != (char *)0x0) {
      local_30 = __s;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_88,__s,&local_89);
      std::allocator<char>::~allocator(&local_89);
      pcVar1 = this->LocalCommonGenerator;
      (**(code **)(*(long *)flags_local + 0x10))(&local_d0,flags_local,defFileFlag);
      cmOutputConverter::ConvertToOutputFormat
                (&local_b0,&(pcVar1->super_cmLocalGenerator).super_cmOutputConverter,&local_d0,SHELL
                );
      std::__cxx11::string::operator+=(local_88,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      (*(this->LocalCommonGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (this->LocalCommonGenerator,mdi,local_88);
      std::__cxx11::string::~string(local_88);
    }
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AddModuleDefinitionFlag(
  cmLinkLineComputer* linkLineComputer, std::string& flags)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || mdi->DefFile.empty()) {
    return;
  }

  // TODO: Create a per-language flag variable.
  const char* defFileFlag =
    this->Makefile->GetDefinition("CMAKE_LINK_DEF_FILE_FLAG");
  if (!defFileFlag) {
    return;
  }

  // Append the flag and value.  Use ConvertToLinkReference to help
  // vs6's "cl -link" pass it to the linker.
  std::string flag = defFileFlag;
  flag += this->LocalCommonGenerator->ConvertToOutputFormat(
    linkLineComputer->ConvertToLinkReference(mdi->DefFile),
    cmOutputConverter::SHELL);
  this->LocalCommonGenerator->AppendFlags(flags, flag);
}